

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O1

void * __thiscall rcg::Buffer::getBase(Buffer *this,uint32_t part)

{
  GC_ERROR GVar1;
  void *pvVar2;
  void *pvVar3;
  void *ret;
  size_t size;
  INFO_DATATYPE type;
  void *local_30;
  size_t local_28;
  INFO_DATATYPE local_1c;
  
  if (this->multipart == true) {
    pvVar2 = Stream::getHandle(this->parent);
    local_30 = (void *)0x0;
    local_28 = 8;
    if (this->buffer != (BUFFER_HANDLE)0x0 && pvVar2 != (void *)0x0) {
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->DSGetBufferPartInfo)(pvVar2,this->buffer,part,0,&local_1c,&local_30,&local_28);
    }
  }
  else {
    pvVar2 = Stream::getHandle(this->parent);
    local_30 = (void *)0x0;
    local_28 = 8;
    if ((this->buffer != (BUFFER_HANDLE)0x0 && pvVar2 != (void *)0x0) &&
       (GVar1 = (*((this->gentl).
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  DSGetBufferInfo)(pvVar2,this->buffer,0,&local_1c,&local_30,&local_28), GVar1 != 0)
       ) {
      local_30 = (void *)0x0;
    }
    pvVar2 = local_30;
    pvVar3 = Stream::getHandle(this->parent);
    local_30 = (void *)0x0;
    local_28 = 8;
    if ((this->buffer != (BUFFER_HANDLE)0x0 && pvVar3 != (void *)0x0) &&
       (GVar1 = (*((this->gentl).
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  DSGetBufferInfo)(pvVar3,this->buffer,0x12,&local_1c,&local_30,&local_28),
       GVar1 != 0)) {
      local_30 = (void *)0x0;
    }
    local_30 = (void *)((long)pvVar2 + (long)local_30);
  }
  return local_30;
}

Assistant:

void *Buffer::getBase(uint32_t part) const
{
  if (multipart)
  {
    return getBufferPartValue<void *>(gentl, parent->getHandle(), buffer, part,
                                      GenTL::BUFFER_PART_INFO_BASE);
  }
  else
  {
    void *ret=getBufferValue<void *>(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_BASE);

    size_t offset=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                         GenTL::BUFFER_INFO_IMAGEOFFSET);

    if (offset > 0)
    {
      ret=reinterpret_cast<char *>(ret)+offset;
    }

    return ret;
  }
}